

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
DefaultState<false>::EndObject(DefaultState<false> *this,Context<false> *ctx,SizeType memberCount)

{
  bool bVar1;
  size_t sVar2;
  stringstream *psVar3;
  ostream *poVar4;
  example **ppeVar5;
  undefined4 in_EDX;
  long in_RSI;
  int label_index;
  BaseState<false> *return_state;
  Context<false> *local_40;
  SizeType in_stack_ffffffffffffffd0;
  SizeType in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_40 = (Context<false> *)
             Context<false>::PopNamespace
                       ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  bVar1 = std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::empty
                    ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    in_stack_ffffffffffffffd4 = *(SizeType *)(in_RSI + 0xe8);
    if (-1 < (int)in_stack_ffffffffffffffd4) {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd4 + 1;
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd0;
      sVar2 = v_array<example_*>::size(*(v_array<example_*> **)(in_RSI + 0x48));
      if ((int)sVar2 <= (int)in_stack_ffffffffffffffd0) {
        psVar3 = Context<false>::error_abi_cxx11_
                           ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        poVar4 = std::operator<<((ostream *)(psVar3 + 0x10),
                                 "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_ffffffffffffffd4 - 1);
        poVar4 = std::operator<<(poVar4," Number of actions=");
        sVar2 = v_array<example_*>::size(*(v_array<example_*> **)(in_RSI + 0x48));
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2 - 1);
        std::operator<<(poVar4," ");
        return (BaseState<false> *)0x0;
      }
      ppeVar5 = v_array<example_*>::operator[]
                          (*(v_array<example_*> **)(in_RSI + 0x48),
                           (long)(int)in_stack_ffffffffffffffd4);
      *(example **)(in_RSI + 0x50) = *ppeVar5;
      *(undefined4 *)(in_RSI + 0xe8) = 0xffffffff;
    }
    LabelObjectState<false>::EndObject
              ((LabelObjectState<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),local_40,
               in_stack_ffffffffffffffd4);
  }
  bVar1 = std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::empty
                    ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    local_40 = *(Context<false> **)(in_RSI + 0x1d8);
  }
  return (BaseState<false> *)local_40;
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType memberCount)
  {
    BaseState<audit>* return_state = ctx.PopNamespace();

    if (ctx.namespace_path.empty())
    {
      int label_index = ctx.label_index_state.index;
      // we're at the end of the example
      if (label_index >= 0)
      {
        // skip shared example
        label_index++;
        if (label_index >= (int)ctx.examples->size())
        {
          ctx.error() << "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                      << (label_index - 1) << " Number of actions=" << ctx.examples->size() - 1 << " ";
          return nullptr;
        }

        // apply labelIndex
        ctx.ex = (*ctx.examples)[label_index];

        // reset for next example
        ctx.label_index_state.index = -1;
      }

      // inject label
      ctx.label_object_state.EndObject(ctx, memberCount);
    }

    // if we're at the top-level go back to ds_state
    return ctx.namespace_path.empty() ? ctx.root_state : return_state;
  }